

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool InputTextFilterCharacter
               (uint *p_char,ImGuiInputTextFlags flags,ImGuiInputTextCallback callback,
               void *user_data,ImGuiInputSource input_source)

{
  bool bVar1;
  int iVar2;
  undefined8 in_RCX;
  code *in_RDX;
  uint in_ESI;
  uint *in_RDI;
  int in_R8D;
  bool bVar3;
  ImGuiInputTextCallbackData callback_data;
  uint c_decimal_point;
  ImGuiContext *g;
  bool pass;
  bool apply_named_filters;
  uint c;
  bool local_82;
  bool local_81;
  undefined4 local_80;
  uint local_7c;
  undefined8 local_78;
  ushort local_70;
  uint local_44;
  ImGuiContext *local_40;
  undefined1 local_32;
  char local_31;
  uint local_30;
  undefined8 local_28;
  code *local_20;
  uint local_14;
  uint *local_10;
  
  local_30 = *in_RDI;
  local_31 = '\x01';
  if (local_30 < 0x20) {
    bVar1 = (in_ESI & 0x4000000) != 0;
    local_81 = local_30 == 10 && bVar1;
    bVar3 = (in_ESI & 0x400) != 0;
    local_82 = local_30 == 9 && bVar3;
    local_32 = local_81 || local_82;
    if ((local_30 != 10 || !bVar1) && (local_30 != 9 || !bVar3)) {
      return false;
    }
    local_31 = '\0';
  }
  if (in_R8D != 4) {
    if (local_30 == 0x7f) {
      return false;
    }
    if ((0xdfff < local_30) && (local_30 < 0xf900)) {
      return false;
    }
  }
  if (0xffff < local_30) {
    return false;
  }
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  if ((local_31 != '\0') && ((in_ESI & 0x2000f) != 0)) {
    local_40 = GImGui;
    local_44 = (uint)GImGui->PlatformLocaleDecimalPoint;
    if ((((in_ESI & 1) != 0) && (((local_30 < 0x30 || (0x39 < local_30)) && (local_30 != local_44)))
        ) && ((((local_30 != 0x2d && (local_30 != 0x2b)) && (local_30 != 0x2a)) &&
              (local_30 != 0x2f)))) {
      return false;
    }
    if ((((in_ESI & 0x20000) != 0) && ((local_30 < 0x30 || (0x39 < local_30)))) &&
       ((local_30 != local_44 &&
        (((((local_30 != 0x2d && (local_30 != 0x2b)) && (local_30 != 0x2a)) &&
          ((local_30 != 0x2f && (local_30 != 0x65)))) && (local_30 != 0x45)))))) {
      return false;
    }
    if (((((in_ESI & 2) != 0) && ((local_30 < 0x30 || (0x39 < local_30)))) &&
        ((local_30 < 0x61 || (0x66 < local_30)))) && ((local_30 < 0x41 || (0x46 < local_30)))) {
      return false;
    }
    if ((((in_ESI & 4) != 0) && (0x60 < local_30)) && (local_30 < 0x7b)) {
      local_30 = local_30 - 0x20;
      *in_RDI = local_30;
    }
    if (((in_ESI & 8) != 0) && (bVar1 = ImCharIsBlankW(local_30), bVar1)) {
      return false;
    }
  }
  if ((local_14 & 0x200) != 0) {
    ImGuiInputTextCallbackData::ImGuiInputTextCallbackData((ImGuiInputTextCallbackData *)0x1aa95e);
    memset(&local_80,0,0x38);
    local_80 = 0x200;
    local_70 = (ushort)local_30;
    local_7c = local_14;
    local_78 = local_28;
    iVar2 = (*local_20)(&local_80);
    if (iVar2 != 0) {
      return false;
    }
    *local_10 = (uint)local_70;
    if (local_70 == 0) {
      return false;
    }
  }
  return true;
}

Assistant:

static bool InputTextFilterCharacter(unsigned int* p_char, ImGuiInputTextFlags flags, ImGuiInputTextCallback callback, void* user_data, ImGuiInputSource input_source)
{
    IM_ASSERT(input_source == ImGuiInputSource_Keyboard || input_source == ImGuiInputSource_Clipboard);
    unsigned int c = *p_char;

    // Filter non-printable (NB: isprint is unreliable! see #2467)
    bool apply_named_filters = true;
    if (c < 0x20)
    {
        bool pass = false;
        pass |= (c == '\n' && (flags & ImGuiInputTextFlags_Multiline));
        pass |= (c == '\t' && (flags & ImGuiInputTextFlags_AllowTabInput));
        if (!pass)
            return false;
        apply_named_filters = false; // Override named filters below so newline and tabs can still be inserted.
    }

    if (input_source != ImGuiInputSource_Clipboard)
    {
        // We ignore Ascii representation of delete (emitted from Backspace on OSX, see #2578, #2817)
        if (c == 127)
            return false;

        // Filter private Unicode range. GLFW on OSX seems to send private characters for special keys like arrow keys (FIXME)
        if (c >= 0xE000 && c <= 0xF8FF)
            return false;
    }

    // Filter Unicode ranges we are not handling in this build
    if (c > IM_UNICODE_CODEPOINT_MAX)
        return false;

    // Generic named filters
    if (apply_named_filters && (flags & (ImGuiInputTextFlags_CharsDecimal | ImGuiInputTextFlags_CharsHexadecimal | ImGuiInputTextFlags_CharsUppercase | ImGuiInputTextFlags_CharsNoBlank | ImGuiInputTextFlags_CharsScientific)))
    {
        // The libc allows overriding locale, with e.g. 'setlocale(LC_NUMERIC, "de_DE.UTF-8");' which affect the output/input of printf/scanf to use e.g. ',' instead of '.'.
        // The standard mandate that programs starts in the "C" locale where the decimal point is '.'.
        // We don't really intend to provide widespread support for it, but out of empathy for people stuck with using odd API, we support the bare minimum aka overriding the decimal point.
        // Change the default decimal_point with:
        //   ImGui::GetCurrentContext()->PlatformLocaleDecimalPoint = *localeconv()->decimal_point;
        // Users of non-default decimal point (in particular ',') may be affected by word-selection logic (is_word_boundary_from_right/is_word_boundary_from_left) functions.
        ImGuiContext& g = *GImGui;
        const unsigned c_decimal_point = (unsigned int)g.PlatformLocaleDecimalPoint;

        // Allow 0-9 . - + * /
        if (flags & ImGuiInputTextFlags_CharsDecimal)
            if (!(c >= '0' && c <= '9') && (c != c_decimal_point) && (c != '-') && (c != '+') && (c != '*') && (c != '/'))
                return false;

        // Allow 0-9 . - + * / e E
        if (flags & ImGuiInputTextFlags_CharsScientific)
            if (!(c >= '0' && c <= '9') && (c != c_decimal_point) && (c != '-') && (c != '+') && (c != '*') && (c != '/') && (c != 'e') && (c != 'E'))
                return false;

        // Allow 0-9 a-F A-F
        if (flags & ImGuiInputTextFlags_CharsHexadecimal)
            if (!(c >= '0' && c <= '9') && !(c >= 'a' && c <= 'f') && !(c >= 'A' && c <= 'F'))
                return false;

        // Turn a-z into A-Z
        if (flags & ImGuiInputTextFlags_CharsUppercase)
            if (c >= 'a' && c <= 'z')
                *p_char = (c += (unsigned int)('A' - 'a'));

        if (flags & ImGuiInputTextFlags_CharsNoBlank)
            if (ImCharIsBlankW(c))
                return false;
    }

    // Custom callback filter
    if (flags & ImGuiInputTextFlags_CallbackCharFilter)
    {
        ImGuiInputTextCallbackData callback_data;
        memset(&callback_data, 0, sizeof(ImGuiInputTextCallbackData));
        callback_data.EventFlag = ImGuiInputTextFlags_CallbackCharFilter;
        callback_data.EventChar = (ImWchar)c;
        callback_data.Flags = flags;
        callback_data.UserData = user_data;
        if (callback(&callback_data) != 0)
            return false;
        *p_char = callback_data.EventChar;
        if (!callback_data.EventChar)
            return false;
    }

    return true;
}